

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase281::run(TestCase281 *this)

{
  WirePointer *pWVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  void *pvVar4;
  int iVar5;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Builder root;
  MallocMessageBuilder builder;
  Builder local_180;
  PointerBuilder local_168;
  StructBuilder local_148;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_180,&local_120.super_MessageBuilder);
  local_168.pointer = local_180.builder.pointer;
  local_168.segment = local_180.builder.segment;
  local_168.capTable = local_180.builder.capTable;
  PointerBuilder::initStruct(&local_148,&local_168,(StructSize)0x20002);
  pWVar1 = local_148.pointers;
  pvVar4 = local_148.data;
  pCVar3 = local_148.capTable;
  pSVar2 = local_148.segment;
  *(undefined2 *)((long)local_148.data + 4) = 0;
  *(int *)local_148.data = 0;
  ((int *)((long)local_148.data + 8))[0] = 0;
  ((int *)((long)local_148.data + 8))[1] = 0;
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = local_148.pointers;
  PointerBuilder::clear(&local_168);
  *(int *)pvVar4 = 0xbc614e;
  ((int *)((long)pvVar4 + 8))[0] = -0x79f22087;
  ((int *)((long)pvVar4 + 8))[1] = 0x7048;
  local_168.segment = pSVar2;
  local_168.capTable = pCVar3;
  local_168.pointer = pWVar1;
  value.super_StringPtr.content.size_ = 7;
  value.super_StringPtr.content.ptr = "foobar";
  PointerBuilder::setBlob<capnp::Text>(&local_168,value);
  if ((*pvVar4 != 0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = (SegmentBuilder *)CONCAT44(local_168.segment._4_4_,0xbc614e);
    local_180.builder.segment = (SegmentBuilder *)CONCAT44(local_180.builder.segment._4_4_,*pvVar4);
    kj::_::Debug::log<char_const(&)[48],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x123,ERROR,
               "\"failed: expected \" \"(12345678) == (foo.getCorge())\", 12345678, foo.getCorge()",
               (char (*) [48])"failed: expected (12345678) == (foo.getCorge())",(int *)&local_168,
               (int *)&local_180);
  }
  if ((*(SegmentBuilder **)((long)pvVar4 + 8) != (SegmentBuilder *)0x7048860ddf79) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = (SegmentBuilder *)0x7048860ddf79;
    local_180.builder.segment = *(SegmentBuilder **)((long)pvVar4 + 8);
    kj::_::Debug::log<char_const(&)[58],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x124,ERROR,
               "\"failed: expected \" \"(123456789012345ll) == (foo.getGrault())\", 123456789012345ll, foo.getGrault()"
               ,(char (*) [58])"failed: expected (123456789012345ll) == (foo.getGrault())",
               (longlong *)&local_168,(long *)&local_180);
  }
  local_168.segment = pSVar2;
  local_168.capTable = pCVar3;
  local_168.pointer = pWVar1;
  PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
  if (((local_180.builder.pointer != (WirePointer *)0x7) ||
      (iVar5 = bcmp(local_180.builder.capTable,"foobar",6), iVar5 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = pSVar2;
    local_168.capTable = pCVar3;
    local_168.pointer = pWVar1;
    PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x125,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\") == (foo.getGarply())\", \"foobar\", foo.getGarply()"
               ,(char (*) [49])"failed: expected (\"foobar\") == (foo.getGarply())",
               (char (*) [7])"foobar",(Builder *)&local_180);
  }
  pWVar1 = local_148.pointers;
  pvVar4 = local_148.data;
  pCVar3 = local_148.capTable;
  pSVar2 = local_148.segment;
  *(undefined2 *)((long)local_148.data + 4) = 2;
  *(int *)local_148.data = 0;
  ((int *)((long)local_148.data + 8))[0] = 0;
  ((int *)((long)local_148.data + 8))[1] = 0;
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = local_148.pointers;
  PointerBuilder::clear(&local_168);
  *(int *)pvVar4 = 0x165ec15;
  local_168.segment = pSVar2;
  local_168.capTable = pCVar3;
  local_168.pointer = pWVar1;
  value_00.super_StringPtr.content.size_ = 7;
  value_00.super_StringPtr.content.ptr = "barbaz";
  PointerBuilder::setBlob<capnp::Text>(&local_168,value_00);
  ((int *)((long)pvVar4 + 8))[0] = -0x683bc540;
  ((int *)((long)pvVar4 + 8))[1] = 0xd556;
  if ((*pvVar4 != 0x165ec15) && (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = (SegmentBuilder *)CONCAT44(local_168.segment._4_4_,0x165ec15);
    local_180.builder.segment = (SegmentBuilder *)CONCAT44(local_180.builder.segment._4_4_,*pvVar4);
    kj::_::Debug::log<char_const(&)[48],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x12e,ERROR,
               "\"failed: expected \" \"(23456789) == (bar.getCorge())\", 23456789, bar.getCorge()",
               (char (*) [48])"failed: expected (23456789) == (bar.getCorge())",(int *)&local_168,
               (int *)&local_180);
  }
  local_168.segment = pSVar2;
  local_168.capTable = pCVar3;
  local_168.pointer = pWVar1;
  PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
  if (((local_180.builder.pointer != (WirePointer *)0x7) ||
      (iVar5 = bcmp(local_180.builder.capTable,"barbaz",6), iVar5 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = pSVar2;
    local_168.capTable = pCVar3;
    local_168.pointer = pWVar1;
    PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x12f,ERROR,
               "\"failed: expected \" \"(\\\"barbaz\\\") == (bar.getGrault())\", \"barbaz\", bar.getGrault()"
               ,(char (*) [49])"failed: expected (\"barbaz\") == (bar.getGrault())",
               (char (*) [7])0x2c5c43,(Builder *)&local_180);
  }
  if ((*(SegmentBuilder **)((long)pvVar4 + 8) != (SegmentBuilder *)0xd55697c43ac0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = (SegmentBuilder *)0xd55697c43ac0;
    local_180.builder.segment = *(SegmentBuilder **)((long)pvVar4 + 8);
    kj::_::Debug::log<char_const(&)[58],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x130,ERROR,
               "\"failed: expected \" \"(234567890123456ll) == (bar.getGarply())\", 234567890123456ll, bar.getGarply()"
               ,(char (*) [58])"failed: expected (234567890123456ll) == (bar.getGarply())",
               (longlong *)&local_168,(long *)&local_180);
  }
  *(undefined2 *)((long)local_148.data + 4) = 1;
  *(int *)local_148.data = 0;
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = local_148.pointers;
  PointerBuilder::clear(&local_168);
  pWVar1 = local_148.pointers + 1;
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = pWVar1;
  PointerBuilder::clear(&local_168);
  *(int *)local_148.data = 0x20f76d2;
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = local_148.pointers;
  value_01.super_StringPtr.content.size_ = 7;
  value_01.super_StringPtr.content.ptr = "bazqux";
  PointerBuilder::setBlob<capnp::Text>(&local_168,value_01);
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  value_02.super_StringPtr.content.size_ = 8;
  value_02.super_StringPtr.content.ptr = "quxquux";
  local_168.pointer = pWVar1;
  PointerBuilder::setBlob<capnp::Text>(&local_168,value_02);
  if ((*local_148.data != 0x20f76d2) && (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = (SegmentBuilder *)CONCAT44(local_168.segment._4_4_,0x20f76d2);
    local_180.builder.segment =
         (SegmentBuilder *)CONCAT44(local_180.builder.segment._4_4_,*local_148.data);
    kj::_::Debug::log<char_const(&)[48],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x139,ERROR,
               "\"failed: expected \" \"(34567890) == (baz.getCorge())\", 34567890, baz.getCorge()",
               (char (*) [48])"failed: expected (34567890) == (baz.getCorge())",(int *)&local_168,
               (int *)&local_180);
  }
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = local_148.pointers;
  PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
  if (((local_180.builder.pointer != (WirePointer *)0x7) ||
      (iVar5 = bcmp(local_180.builder.capTable,"bazqux",6), iVar5 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = local_148.segment;
    local_168.capTable = local_148.capTable;
    local_168.pointer = local_148.pointers;
    PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x13a,ERROR,
               "\"failed: expected \" \"(\\\"bazqux\\\") == (baz.getGrault())\", \"bazqux\", baz.getGrault()"
               ,(char (*) [49])"failed: expected (\"bazqux\") == (baz.getGrault())",
               (char (*) [7])"bazqux",(Builder *)&local_180);
  }
  local_168.segment = local_148.segment;
  local_168.capTable = local_148.capTable;
  local_168.pointer = pWVar1;
  PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
  if (((local_180.builder.pointer != (WirePointer *)0x8) ||
      (iVar5 = bcmp(local_180.builder.capTable,"quxquux",7), iVar5 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_168.segment = local_148.segment;
    local_168.capTable = local_148.capTable;
    local_168.pointer = pWVar1;
    PointerBuilder::getBlob<capnp::Text>((Builder *)&local_180,&local_168,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[8],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x13b,ERROR,
               "\"failed: expected \" \"(\\\"quxquux\\\") == (baz.getGarply())\", \"quxquux\", baz.getGarply()"
               ,(char (*) [50])"failed: expected (\"quxquux\") == (baz.getGarply())",
               (char (*) [8])"quxquux",(Builder *)&local_180);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Encoding, Groups) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestGroups>();

  {
    auto foo = root.getGroups().initFoo();
    foo.setCorge(12345678);
    foo.setGrault(123456789012345ll);
    foo.setGarply("foobar");

    EXPECT_EQ(12345678, foo.getCorge());
    EXPECT_EQ(123456789012345ll, foo.getGrault());
    EXPECT_EQ("foobar", foo.getGarply());
  }

  {
    auto bar = root.getGroups().initBar();
    bar.setCorge(23456789);
    bar.setGrault("barbaz");
    bar.setGarply(234567890123456ll);

    EXPECT_EQ(23456789, bar.getCorge());
    EXPECT_EQ("barbaz", bar.getGrault());
    EXPECT_EQ(234567890123456ll, bar.getGarply());
  }

  {
    auto baz = root.getGroups().initBaz();
    baz.setCorge(34567890);
    baz.setGrault("bazqux");
    baz.setGarply("quxquux");

    EXPECT_EQ(34567890, baz.getCorge());
    EXPECT_EQ("bazqux", baz.getGrault());
    EXPECT_EQ("quxquux", baz.getGarply());
  }
}